

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall mkvmuxer::Tracks::Write(Tracks *this,IMkvWriter *writer)

{
  uint32_t uVar1;
  Track *pTVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  int extraout_var_00;
  int extraout_var_01;
  ulong uVar6;
  ulong uVar7;
  uint64 size;
  
  uVar1 = this->track_entries_size_;
  uVar7 = (ulong)(int)uVar1;
  if ((long)uVar7 < 1) {
    size = 0;
  }
  else {
    uVar6 = 0;
    size = 0;
    do {
      if (this->track_entries_ == (Track **)0x0) {
        return false;
      }
      if (this->track_entries_size_ <= uVar6) {
        return false;
      }
      pTVar2 = this->track_entries_[uVar6];
      if (pTVar2 == (Track *)0x0) {
        return false;
      }
      iVar4 = (*pTVar2->_vptr_Track[4])();
      size = size + CONCAT44(extraout_var,iVar4);
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar6);
  }
  bVar3 = WriteEbmlMasterElement(writer,0x1654ae6b,size);
  if (bVar3) {
    iVar4 = (*writer->_vptr_IMkvWriter[1])(writer);
    if (-1 < extraout_var_00) {
      if (0 < (int)uVar1) {
        uVar6 = 0;
        do {
          iVar5 = (*this->track_entries_[uVar6]->_vptr_Track[5])(this->track_entries_[uVar6],writer)
          ;
          if ((char)iVar5 == '\0') {
            return false;
          }
          uVar6 = uVar6 + 1;
        } while (uVar7 != uVar6);
      }
      iVar5 = (*writer->_vptr_IMkvWriter[1])(writer);
      if (-1 < extraout_var_01) {
        if (CONCAT44(extraout_var_01,iVar5) - CONCAT44(extraout_var_00,iVar4) == size) {
          this->wrote_tracks_ = true;
          return true;
        }
        return false;
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool Tracks::Write(IMkvWriter* writer) const {
  uint64_t size = 0;
  const int32_t count = track_entries_size();
  for (int32_t i = 0; i < count; ++i) {
    const Track* const track = GetTrackByIndex(i);

    if (!track)
      return false;

    size += track->Size();
  }

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvTracks, size))
    return false;

  const int64_t payload_position = writer->Position();
  if (payload_position < 0)
    return false;

  for (int32_t i = 0; i < count; ++i) {
    const Track* const track = GetTrackByIndex(i);
    if (!track->Write(writer))
      return false;
  }

  const int64_t stop_position = writer->Position();
  if (stop_position < 0 ||
      stop_position - payload_position != static_cast<int64_t>(size))
    return false;

  wrote_tracks_ = true;
  return true;
}